

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int get_default_directory(AP_CTX *ctx)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  size_t size;
  char *var;
  int rc;
  AP_CTX *ctx_local;
  
  var._4_4_ = 0;
  __s = getenv("HOME");
  if (__s == (char *)0x0) {
    ap_log(AP_LOG_LEVEL_ERROR,"Can not get HOME environment variable\n");
    var._4_4_ = 6;
  }
  else if (*__s == '\0') {
    ap_log(AP_LOG_LEVEL_ERROR,"Empty HOME environment variable\n");
    var._4_4_ = 6;
  }
  else {
    sVar1 = strlen(__s);
    sVar1 = sVar1 + 7;
    pcVar2 = (char *)calloc(1,sVar1);
    ctx->default_dir = pcVar2;
    ap_str_strlcpy(ctx->default_dir,__s,sVar1);
    ap_str_strlcat(ctx->default_dir,"/.ssh",sVar1);
  }
  if ((var._4_4_ != 0) && (ctx->default_dir != (char *)0x0)) {
    free(ctx->default_dir);
  }
  return var._4_4_;
}

Assistant:

static int get_default_directory (AP_CTX *ctx)
{
	int			rc					= AP_NO_ERROR;
	const char	*var				= NULL;
	size_t		size;

#	if defined (_WIN32)
	var = getenv ("USERPROFILE"); 
#	else
	var = getenv ("HOME"); 
#	endif
	if (var == NULL)
	{
		ap_error ("Can not get HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	if (*var == '\0')
	{
		ap_error ("Empty HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	size = strlen (var) + sizeof ("/.ssh") + 1;

	ctx->default_dir = calloc (1, size);
	if (rc != AP_NO_ERROR)
	{
		ap_error ("Can not allocate memory for 'dir'\n");
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	ap_str_strlcpy (ctx->default_dir, var, size);
	ap_str_strlcat (ctx->default_dir, "/.ssh", size);

finish:
	if (rc != AP_NO_ERROR)
	{
		if (ctx->default_dir != NULL)
		{
			free (ctx->default_dir);
		}
	}

	return rc;
}